

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pMVar3;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar4;
  pointer pcVar5;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar6;
  double dVar7;
  PrecisionCase *pPVar8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar9;
  FloatFormat *fmt;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  ContextType type;
  int iVar13;
  uint uVar14;
  _Rb_tree_node_base *p_Var15;
  char *__s;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  IVal *pIVar19;
  IVal *pIVar20;
  TestError *this_00;
  TestLog *pTVar21;
  long lVar22;
  Matrix<float,_4,_2> *val;
  undefined8 *puVar23;
  size_t sVar24;
  pointer pMVar25;
  IVal reference1;
  IVal in2;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  FuncSet funcs;
  ostringstream oss;
  undefined4 auStack_598 [3];
  IVal local_589;
  string local_588;
  PrecisionCase *local_560;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_558;
  Statement *local_550;
  pointer local_548;
  size_t local_540;
  ulong local_538;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_530;
  long local_528;
  FloatFormat *local_520;
  string local_518;
  undefined1 local_4f8 [8];
  pointer pVStack_4f0;
  undefined1 local_4e8 [16];
  double local_4d8;
  Data local_4d0;
  undefined4 local_4c0;
  double adStack_498 [2];
  ios_base local_488 [8];
  ios_base local_480 [264];
  pointer local_378;
  ResultCollector *local_370;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_368;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_338;
  FloatFormat local_308;
  undefined1 local_2e0 [56];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [24];
  double local_240;
  undefined1 local_1a8 [24];
  undefined8 local_190 [11];
  ios_base local_138 [264];
  
  pMVar25 = (inputs->in0).
            super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar24 = (long)pMVar3 - (long)pMVar25 >> 5;
  local_558 = variables;
  local_550 = stmt;
  local_530 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_338,sVar24);
  local_2a8._M_p = (pointer)&local_298;
  local_2e0._0_4_ = GLSL_VERSION_300_ES;
  local_2e0._8_8_ = (pointer)0x0;
  local_2e0._16_8_ = (pointer)0x0;
  local_2e0._24_8_ = (pointer)0x0;
  local_2e0._32_8_ = (pointer)0x0;
  local_2e0._40_8_ = (pointer)0x0;
  local_2e0._48_8_ = (pointer)0x0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_308.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_308.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_308.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_308.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_308.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_308.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_308.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_308.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_308._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_368._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_368._M_impl.super__Rb_tree_header._M_header;
  local_368._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_368._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_368._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4f8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_368._M_impl.super__Rb_tree_header._M_header._M_right =
       local_368._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"Statement: ",0xb);
  (*local_550->_vptr_Statement[2])(local_550,(ostringstream *)&pVStack_4f0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_548 = pMVar25;
  local_540 = sVar24;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4f0);
  std::ios_base::~ios_base(local_480);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_268 + 8);
  local_268._8_4_ = _S_red;
  local_258._0_8_ = (_Base_ptr)0x0;
  local_240 = 0.0;
  local_258._8_8_ = p_Var2;
  local_258._16_8_ = p_Var2;
  (*local_550->_vptr_Statement[4])(local_550,local_268);
  if ((_Rb_tree_node_base *)local_258._8_8_ != p_Var2) {
    p_Var15 = (_Rb_tree_node_base *)local_258._8_8_;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var2);
  }
  if (local_240 != 0.0) {
    local_4f8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4f0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4f0,local_588._M_dataplus._M_p,local_588._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4f0);
    std::ios_base::~ios_base(local_480);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"precision ",10);
  __s = glu::getPrecisionName((this->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_598 + (int)((TestLog *)((long)local_4f8 + -0x18))->m_log + 0xa0);
  }
  else {
    sVar16 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,__s,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
  std::ios_base::~ios_base(local_488);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_2e0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar21 = (TestLog *)(plVar17 + 2);
    if ((TestLog *)*plVar17 == pTVar21) {
      local_4e8._0_8_ = pTVar21->m_log;
      local_4e8._8_8_ = plVar17[3];
      local_4f8 = (undefined1  [8])local_4e8;
    }
    else {
      local_4e8._0_8_ = pTVar21->m_log;
      local_4f8 = (undefined1  [8])*plVar17;
    }
    pVStack_4f0 = (pointer)plVar17[1];
    *plVar17 = (long)pTVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_4f8);
    if (local_4f8 != (undefined1  [8])local_4e8) {
      operator_delete((void *)local_4f8,(ulong)(local_4e8._0_8_ + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2e0 + 8),1);
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_4f8,this,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  uVar10 = local_2e0._8_8_;
  std::__cxx11::string::operator=((string *)local_2e0._8_8_,(string *)local_4f8);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_4d8);
  glu::VarType::~VarType((VarType *)&local_4d8);
  if (local_4f8 != (undefined1  [8])local_4e8) {
    operator_delete((void *)local_4f8,(ulong)(local_4e8._0_8_ + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2e0 + 0x20),1);
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_4f8,this,
             (local_558->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  uVar10 = local_2e0._32_8_;
  std::__cxx11::string::operator=((string *)local_2e0._32_8_,(string *)local_4f8);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_4d8);
  glu::VarType::~VarType((VarType *)&local_4d8);
  if (local_4f8 != (undefined1  [8])local_4e8) {
    operator_delete((void *)local_4f8,(ulong)(local_4e8._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
  (*local_550->_vptr_Statement[2])(local_550,local_4f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
  std::ios_base::~ios_base(local_488);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar18 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_2e0)
  ;
  sVar24 = local_540;
  local_4f8 = (undefined1  [8])
              (local_530->in0).
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_4f0 = (local_530->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_4e8._0_8_ =
       (local_530->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4e8._8_8_ =
       (local_530->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_338.out0.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_338.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
  (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,sVar24 & 0xffffffff,local_4f8,local_1a8);
  (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_4f8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
  pVVar9 = local_558;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_368,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_4f8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (pVVar9->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_268);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (pVVar9->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_588);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (pVVar9->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_518);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_368,
             (pVVar9->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (pVVar9->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_589);
  if (pMVar3 == local_548) {
LAB_0078c66d:
    local_4f8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4f0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_520 = &(this->m_ctx).floatFormat;
    local_370 = &this->m_status;
    local_378 = (pointer)(sVar24 + (sVar24 == 0));
    local_528 = 0;
    pMVar25 = (pointer)0x0;
    local_538 = 0;
    local_560 = this;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      local_548 = pMVar25;
      if (((ulong)pMVar25 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_560->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_520;
      pMVar25 = (local_530->in0).
                super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_588.field_2._M_allocated_capacity = 0;
      local_588.field_2._8_8_ = 0;
      local_588._M_dataplus._M_p = (char *)0x0;
      local_588._M_string_length = 0;
      lVar22 = 4;
      do {
        auStack_598[lVar22] =
             *(undefined4 *)((long)((pMVar25->m_data).m_data + -1) + lVar22 * 4 + local_528);
        *(undefined4 *)((long)&local_588._M_dataplus._M_p + lVar22 * 4) =
             *(undefined4 *)((long)(pMVar25->m_data).m_data[0].m_data + lVar22 * 4 + local_528);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 8);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                ((IVal *)local_268,local_520,(Matrix<float,_4,_2> *)&local_588);
      pVVar9 = local_558;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_4f8,fmt,(IVal *)local_268);
      pIVar19 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_368,
                           (pVVar9->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar22 = 0;
      do {
        *(undefined8 *)((long)&(pIVar19->m_data).m_data[0].m_data[0].m_hi + lVar22) =
             *(undefined8 *)(local_4e8 + lVar22);
        dVar7 = *(double *)((long)&pVStack_4f0 + lVar22);
        pbVar1 = &(pIVar19->m_data).m_data[0].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar1 = *(undefined8 *)(local_4f8 + lVar22);
        *(double *)(pbVar1 + 8) = dVar7;
        dVar7 = *(double *)((long)adStack_498 + lVar22 + 8);
        pbVar1 = &(pIVar19->m_data).m_data[1].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar1 = *(undefined8 *)((long)adStack_498 + lVar22);
        *(double *)(pbVar1 + 8) = dVar7;
        *(undefined8 *)((long)&(pIVar19->m_data).m_data[1].m_data[0].m_hi + lVar22) =
             *(undefined8 *)(local_488 + lVar22);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x60);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_368,
                 (pVVar9->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_368,
                 (pVVar9->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_368,
                 (pVVar9->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_4d0.basic.type = (local_560->m_ctx).precision;
      local_4d8 = local_520->m_maxValue;
      local_4f8 = *(undefined1 (*) [8])local_520;
      pVStack_4f0 = *(pointer *)&local_520->m_fractionBits;
      local_4e8._0_8_ = *(undefined8 *)&local_520->m_hasInf;
      local_4e8._8_8_ = *(undefined8 *)&local_520->m_exactPrecision;
      local_4c0 = 0;
      local_4d0._8_8_ = &local_368;
      (*local_550->_vptr_Statement[3])(local_550,local_4f8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_368,
                           (pVVar9->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_4f8,&local_308,pIVar20);
      pMVar25 = local_548;
      pIVar20 = (IVal *)local_4f8;
      puVar23 = (undefined8 *)local_1a8;
      bVar12 = true;
      do {
        bVar11 = bVar12;
        lVar22 = 0;
        do {
          *(undefined8 *)((long)puVar23 + lVar22 + 0x10) =
               *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar22);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar22;
          dVar7 = *(double *)(pbVar1 + 8);
          *(undefined8 *)((long)puVar23 + lVar22) = *(undefined8 *)pbVar1;
          ((undefined8 *)((long)puVar23 + lVar22))[1] = dVar7;
          lVar22 = lVar22 + 0x30;
        } while (lVar22 != 0xc0);
        pIVar20 = (IVal *)(local_4e8 + 8);
        puVar23 = local_190;
        bVar12 = false;
      } while (bVar11);
      bVar12 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          local_338.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_548);
      local_4f8 = (undefined1  [8])local_4e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4f8,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_370,bVar12,(string *)local_4f8);
      if (local_4f8 != (undefined1  [8])local_4e8) {
        operator_delete((void *)local_4f8,(ulong)(local_4e8._0_8_ + 1));
      }
      pVVar9 = local_558;
      if (!bVar12) {
        uVar14 = (int)local_538 + 1;
        local_538 = (ulong)uVar14;
        if ((int)uVar14 < 0x65) {
          local_4f8 = (undefined1  [8])((local_560->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"\t",1);
          pVVar4 = (pVVar9->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                   .m_ptr;
          val = (Matrix<float,_4,_2> *)local_258;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_268._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4f0,(char *)local_268._0_8_,
                     CONCAT44(local_268._12_4_,local_268._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0," = ",3);
          valueToString<tcu::Matrix<float,4,2>>
                    (&local_588,(BuiltinPrecisionTests *)&local_308,
                     (FloatFormat *)
                     ((local_530->in0).
                      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)pMVar25),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4f0,local_588._M_dataplus._M_p,local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != &local_588.field_2) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_4,_2> *)local_268._0_8_ != (Matrix<float,_4,_2> *)local_258) {
            operator_delete((void *)local_268._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_258._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"\t",1);
          pVVar6 = (pVVar9->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_258;
          pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
          local_268._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4f0,(char *)local_268._0_8_,
                     CONCAT44(local_268._12_4_,local_268._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_588,(BuiltinPrecisionTests *)&local_308,
                     (FloatFormat *)
                     (local_338.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)pMVar25),
                     (Matrix<float,_2,_4> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4f0,local_588._M_dataplus._M_p,local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4f0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_518,(BuiltinPrecisionTests *)&local_308,(FloatFormat *)local_1a8,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4f0,local_518._M_dataplus._M_p,local_518._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != &local_588.field_2) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_268._0_8_ != (IVal *)local_258) {
            operator_delete((void *)local_268._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_258._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4f0);
          std::ios_base::~ios_base(local_480);
        }
      }
      pPVar8 = local_560;
      pMVar25 = (pointer)((long)(local_548->m_data).m_data[0].m_data + 1);
      local_528 = local_528 + 0x20;
    } while (pMVar25 != local_378);
    iVar13 = (int)local_538;
    if (iVar13 < 0x65) {
      this = local_560;
      if (iVar13 == 0) goto LAB_0078c66d;
    }
    else {
      local_4f8 = (undefined1  [8])((local_560->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_4f0,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4f0);
      std::ios_base::~ios_base(local_480);
    }
    local_4f8 = (undefined1  [8])((pPVar8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4f0);
    std::ostream::operator<<((ostringstream *)&pVStack_4f0,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4f0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4f0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4f0);
  std::ios_base::~ios_base(local_480);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p,
                    CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2e0 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2e0 + 8));
  if (local_338.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}